

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O0

void __thiscall
btMultiBodyJointLimitConstraint::finalizeMultiDof(btMultiBodyJointLimitConstraint *this)

{
  uint uVar1;
  btMultibodyLink *pbVar2;
  btScalar *pbVar3;
  long in_RDI;
  uint offset;
  int index;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  btMultiBodyConstraint::allocateJacobiansMultiDof
            ((btMultiBodyConstraint *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0))
  ;
  index = (int)((ulong)in_RDI >> 0x20);
  pbVar2 = btMultiBody::getLink
                     ((btMultiBody *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      index);
  uVar1 = pbVar2->m_dofOffset + 6;
  pbVar3 = btMultiBodyConstraint::jacobianA
                     ((btMultiBodyConstraint *)CONCAT44(uVar1,in_stack_fffffffffffffff0),index);
  pbVar3[uVar1] = 1.0;
  pbVar3 = btMultiBodyConstraint::jacobianB
                     ((btMultiBodyConstraint *)CONCAT44(uVar1,in_stack_fffffffffffffff0),index);
  pbVar3[uVar1] = -1.0;
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x28);
  return;
}

Assistant:

void btMultiBodyJointLimitConstraint::finalizeMultiDof()
{
	// the data.m_jacobians never change, so may as well
    // initialize them here

	allocateJacobiansMultiDof();

	unsigned int offset = 6 + m_bodyA->getLink(m_linkA).m_dofOffset;

	// row 0: the lower bound
	jacobianA(0)[offset] = 1;
	// row 1: the upper bound
	//jacobianA(1)[offset] = -1;
	jacobianB(1)[offset] = -1;

	m_numDofsFinalized = m_jacSizeBoth;
}